

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void destroy_tractor_beams(Am_Object *ship_obj)

{
  Am_Slot_Key AVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  ushort uVar5;
  Am_Object other_ship;
  Am_Object beam;
  Am_Value_List beams;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50 [16];
  Am_Object local_40;
  Am_Object local_38;
  
  local_58.data = (Am_Object_Data *)0x0;
  local_60.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(local_50);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship_obj,(ulong)TB_LIST);
  Am_Value_List::operator=(local_50,pAVar3);
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    AVar1 = TB_LIST;
    if (cVar2 != '\0') break;
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_58,pAVar3);
    uVar5 = (ushort)&local_58;
    pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_SOURCE);
    Am_Object::operator=(&local_60,pAVar3);
    cVar2 = Am_Object::operator==(&local_60,ship_obj);
    if (cVar2 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_DEST);
      Am_Object::operator=(&local_60,pAVar3);
    }
    Am_Object::Am_Object(&local_38,&local_58);
    Am_Object::Am_Object(&local_40,&local_60);
    remove_tractor_beam_from_ship(&local_38,&local_40);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_38);
    Am_Value_List::Delete(SUB81(local_50,0));
    Am_Object::Destroy();
    Am_Value_List::Next();
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_50);
  Am_Object::Set((ushort)ship_obj,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  Am_Value_List::~Am_Value_List(local_50);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  return;
}

Assistant:

void
destroy_tractor_beams(Am_Object ship_obj)
{
  Am_Object beam, other_ship;
  Am_Value_List beams;
  beams = ship_obj.Get(TB_LIST);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();

    // Remove tractor beam from the value list of its other attached ship
    other_ship = beam.Get(TB_SOURCE);
    if (other_ship == ship_obj)
      // Oops, ship_obj was the source, we meant to get TB_DEST
      other_ship = beam.Get(TB_DEST);
    remove_tractor_beam_from_ship(beam, other_ship);

    beams.Delete(); // remove the current beam from my list
    beam.Destroy(); // destroy the actual beam object
  }
  ship_obj.Set(TB_LIST, beams); //beams should now be empty
}